

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall CMU462::Matrix4x4::operator-(Matrix4x4 *this)

{
  Matrix4x4 *B;
  Matrix4x4 *in_RDI;
  
  in_RDI->entries[3].z = 0.0;
  in_RDI->entries[3].w = 0.0;
  in_RDI->entries[3].x = 0.0;
  in_RDI->entries[3].y = 0.0;
  in_RDI->entries[2].z = 0.0;
  in_RDI->entries[2].w = 0.0;
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[1].w = 0.0;
  in_RDI->entries[1].x = 0.0;
  in_RDI->entries[1].y = 0.0;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[0].w = 0.0;
  in_RDI->entries[0].x = 0.0;
  in_RDI->entries[0].y = 0.0;
  in_RDI->entries[0].x = -this->entries[0].x;
  in_RDI->entries[1].x = -this->entries[1].x;
  in_RDI->entries[2].x = -this->entries[2].x;
  in_RDI->entries[3].x = -this->entries[3].x;
  in_RDI->entries[0].y = -this->entries[0].y;
  in_RDI->entries[1].y = -this->entries[1].y;
  in_RDI->entries[2].y = -this->entries[2].y;
  in_RDI->entries[3].y = -this->entries[3].y;
  in_RDI->entries[0].z = -this->entries[0].z;
  in_RDI->entries[1].z = -this->entries[1].z;
  in_RDI->entries[2].z = -this->entries[2].z;
  in_RDI->entries[3].z = -this->entries[3].z;
  in_RDI->entries[0].w = -this->entries[0].w;
  in_RDI->entries[1].w = -this->entries[1].w;
  in_RDI->entries[2].w = -this->entries[2].w;
  in_RDI->entries[3].w = -this->entries[3].w;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator-( void ) const {

  // returns -A (Negation).
  const Matrix4x4& A( *this );
  Matrix4x4 B;

  B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2); B(0,3) = -A(0,3);
  B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2); B(1,3) = -A(1,3);
  B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2); B(2,3) = -A(2,3);
	B(3,0) = -A(3,0); B(3,1) = -A(3,1); B(3,2) = -A(3,2); B(3,3) = -A(3,3);

    return B;
  }